

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

void __thiscall btVectorX<float>::resize(btVectorX<float> *this,int rows)

{
  float *unaff_retaddr;
  
  btAlignedObjectArray<float>::resize(&this->m_storage,rows,unaff_retaddr);
  return;
}

Assistant:

void resize(int rows)
	{
		m_storage.resize(rows);
	}